

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<unsigned_short>(uint length,unsigned_short value)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint i;
  unsigned_short *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  unsigned_short *local_50;
  shared_ptr<unsigned_short> pa;
  shared_ptr<unsigned_short> pb;
  
  uVar3 = (ulong)length;
  puVar4 = sse::common::malloc<unsigned_short>(length + 1);
  std::__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2> *)&local_50,puVar4,
             sse::common::free<unsigned_short>);
  puVar4 = sse::common::malloc<unsigned_short>(length + 1);
  std::__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar4,
             sse::common::free<unsigned_short>);
  local_50[uVar3] = 0x7f;
  *(undefined2 *)
   ((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar3 * 2) = 0x3f;
  nosimd::common::set<unsigned_short>(value,local_50,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    puVar4 = local_50 + uVar6;
    uVar6 = uVar6 + 1;
    if (*puVar4 != value) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar5 + 1) = 0x16;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  nosimd::common::copy<unsigned_short>
            (local_50,(unsigned_short *)
                      pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    lVar2 = uVar6 * 2;
    uVar6 = uVar6 + 1;
    if (*(unsigned_short *)
         ((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + lVar2) != value) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar5 + 1) = 0x1d;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<unsigned_short>
            ((unsigned_short *)
             pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    lVar2 = uVar6 * 2;
    uVar6 = uVar6 + 1;
    if (*(short *)((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar2) != 0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar5 + 1) = 0x24;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    local_50[uVar6] = (unsigned_short)uVar6;
  }
  nosimd::common::copy<unsigned_short>
            (local_50,(unsigned_short *)
                      pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    uVar1 = uVar6 + 1;
    lVar2 = uVar6 * 2;
    uVar6 = uVar1;
    if ((short)((short)uVar1 + -1) !=
        *(short *)((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar2)) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned short]";
      *(undefined4 *)(puVar5 + 1) = 0x2d;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  if ((local_50[uVar3] == 0x7f) &&
     (*(short *)((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 2) == 0x3f)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar5 = "void test_common(unsigned int, T) [T = unsigned short]";
  *(undefined4 *)(puVar5 + 1) = 0x31;
  *(uint *)((long)puVar5 + 0xc) = length;
  __cxa_throw(puVar5,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}